

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

int __thiscall ON_MorphControl::Order(ON_MorphControl *this,int dir)

{
  int iVar1;
  int local_2c;
  int local_18;
  int rc;
  int dir_local;
  ON_MorphControl *this_local;
  
  local_18 = 0;
  iVar1 = this->m_varient;
  if (iVar1 == 1) {
    if (dir == 0) {
      local_2c = ON_NurbsCurve::Order(&this->m_nurbs_curve);
    }
    else {
      local_2c = 0;
    }
    local_18 = local_2c;
  }
  else if (iVar1 == 2) {
    local_18 = ON_NurbsSurface::Order(&this->m_nurbs_surface,dir);
  }
  else if (iVar1 == 3) {
    local_18 = ON_NurbsCage::Order(&this->m_nurbs_cage,dir);
  }
  return local_18;
}

Assistant:

int ON_MorphControl::Order(int dir) const
{
  int rc = 0;
  switch(m_varient)
  {
  case 1:
    rc = (0==dir) ? m_nurbs_curve.Order() : 0;
    break;
  case 2:
    rc = m_nurbs_surface.Order(dir);
    break;
  case 3:
    rc = m_nurbs_cage.Order(dir);
    break;
  }
  return rc;
}